

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_command_line.cpp
# Opt level: O0

void __thiscall
(anonymous_namespace)::ClCommandLine::add<char_const*>(ClCommandLine *this,string *s,char *strs)

{
  char *pcVar1;
  allocator local_41;
  string local_40;
  char *local_20;
  char *strs_local;
  string *s_local;
  ClCommandLine *this_local;
  
  local_20 = strs;
  strs_local = (char *)s;
  s_local = (string *)this;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(this + 0x10),s);
  pcVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,pcVar1,&local_41);
  anon_unknown.dwarf_19dfa::ClCommandLine::add<>((ClCommandLine *)this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return;
}

Assistant:

void add (std::string const & s, Strs... strs) {
            strings_.push_back (s);
            this->add (strs...);
        }